

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::create_exact_path_graphs
          (Proof *this,int g,NamedVertex *p,NamedVertex *q,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *between_p_and_q,NamedVertex *t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *n_t,vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *two_away_from_t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *d_n_t)

{
  long *plVar1;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  pointer ppVar3;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar4;
  pointer plVar5;
  bool bVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var10;
  iterator iVar11;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var12;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *b;
  pointer ppVar13;
  pointer ppVar14;
  pointer plVar15;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *b_4;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *u;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar16;
  pointer ppVar17;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *u_3;
  pointer ppVar18;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *u_2;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *w;
  pointer ppVar19;
  key_type local_230;
  NamedVertex *local_210;
  NamedVertex *local_208;
  int local_1fc;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  pointer local_1f0;
  vector<long,_std::allocator<long>_> things_to_add_up;
  undefined1 local_1c8 [8];
  undefined8 local_1c0;
  stringstream tidied_up;
  ostream local_1a8 [376];
  
  local_210 = p;
  local_208 = q;
  local_1fc = g;
  __range2 = between_p_and_q;
  std::__cxx11::stringstream::stringstream((stringstream *)&tidied_up);
  poVar7 = std::operator<<(local_1a8,"1 ~x");
  local_230._M_dataplus._M_p = (pointer)(long)local_210->first;
  local_230._M_string_length = (size_type)t->first;
  pmVar8 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_230);
  std::operator<<(poVar7,(string *)pmVar8);
  ppVar2 = (d_n_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar16 = (d_n_t->
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar2;
      ppVar16 = ppVar16 + 1) {
    bVar6 = std::operator==(ppVar16,t);
    if (!bVar6) {
      poVar7 = std::operator<<(local_1a8," 1 x");
      local_230._M_dataplus._M_p = (pointer)(long)local_208->first;
      local_230._M_string_length = (size_type)ppVar16->first;
      pmVar8 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,(key_type *)&local_230);
      std::operator<<(poVar7,(string *)pmVar8);
    }
  }
  std::operator<<(local_1a8," >= 1 ;");
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  std::__cxx11::stringbuf::str();
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&((_Var12._M_head_impl)->cached_proof_lines)._M_h,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    poVar7 = std::operator<<((ostream *)((_Var12._M_head_impl)->proof_stream)._M_t,"* adjacency ");
    poVar7 = std::operator<<(poVar7,(string *)&local_210->second);
    poVar7 = std::operator<<(poVar7," maps to ");
    poVar7 = std::operator<<(poVar7,(string *)&t->second);
    poVar7 = std::operator<<(poVar7," in G^[");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1fc);
    poVar7 = std::operator<<(poVar7,"x2] so ");
    poVar7 = std::operator<<(poVar7,(string *)&local_208->second);
    std::operator<<(poVar7," maps to one of...\n");
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    if ((_Var12._M_head_impl)->recover_encoding == true) {
      recover_injectivity_constraint(this,t->first);
      ppVar17 = (__range2->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar14 = (__range2->
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar17;
          ppVar14 = ppVar14 + 1) {
        recover_adjacency_lines(this,0,local_210->first,ppVar14->first,t->first);
        ppVar3 = (n_t->
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar19 = (n_t->
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; ppVar19 != ppVar3;
            ppVar19 = ppVar19 + 1) {
          recover_adjacency_lines(this,0,ppVar14->first,local_208->first,ppVar19->first);
        }
        recover_at_most_one_constraint(this,ppVar14->first);
      }
      ppVar18 = (two_away_from_t->
                super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar13 = (two_away_from_t->
                     super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar18;
          ppVar13 = ppVar13 + 1) {
        bVar6 = std::operator==(&ppVar13->first,t);
        if (!bVar6) {
          ppVar16 = (d_n_t->
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          _Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>const*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<int,std::__cxx11::string>const>>
                             ((d_n_t->
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,ppVar16,ppVar13);
          if (ppVar16 == _Var10._M_current) {
            ppVar17 = (__range2->
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar14 = (__range2->
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar17;
                ppVar14 = ppVar14 + 1) {
              recover_adjacency_lines(this,0,local_210->first,ppVar14->first,t->first);
              recover_adjacency_lines(this,0,local_208->first,ppVar14->first,(ppVar13->first).first)
              ;
            }
            ppVar17 = (ppVar13->second).
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar14 = (ppVar13->second).
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar17;
                ppVar14 = ppVar14 + 1) {
              recover_injectivity_constraint(this,ppVar14->first);
            }
          }
        }
      }
      _Var12._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    }
    std::operator<<((ostream *)
                    ((_Var12._M_head_impl)->proof_stream)._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ,"# 1\n");
    std::operator<<((ostream *)
                    (((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    proof_stream)._M_t,"p");
    bVar6 = true;
    ppVar17 = (__range2->
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar14 = (__range2->
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar17;
        ppVar14 = ppVar14 + 1) {
      poVar7 = std::operator<<((ostream *)
                               (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t," ");
      local_230._M_dataplus._M_p = (pointer)(long)t->first;
      local_230._M_string_length = (size_type)ppVar14->first;
      local_230.field_2._M_allocated_capacity = (size_type)local_210->first;
      local_230.field_2._8_8_ = 0;
      std::
      map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[](&((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    adjacency_lines,(key_type *)&local_230);
      std::ostream::_M_insert<long>((long)poVar7);
      if (!bVar6) {
        std::operator<<((ostream *)
                        (((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        proof_stream)._M_t," s +");
      }
      bVar6 = false;
    }
    local_1f0 = (pointer)(__range2->
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar14 = (__range2->
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; (pointer)ppVar14 != local_1f0;
        ppVar14 = ppVar14 + 1) {
      ppVar19 = (n_t->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar17 = (n_t->
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppVar17 != ppVar19;
          ppVar17 = ppVar17 + 1) {
        local_230._M_dataplus._M_p = (pointer)(long)ppVar17->first;
        local_230.field_2._M_allocated_capacity = (size_type)ppVar14->first;
        local_230._M_string_length = (size_type)local_208->first;
        local_230.field_2._8_8_ = 0;
        iVar11 = std::
                 _Rb_tree<std::tuple<long,_long,_long,_long>,_std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::find(&(((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         adjacency_lines)._M_t,(key_type *)&local_230);
        _Var12._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
        if (iVar11._M_node != (_Base_ptr)((long)&(_Var12._M_head_impl)->adjacency_lines + 8U)) {
          poVar7 = std::operator<<((ostream *)((_Var12._M_head_impl)->proof_stream)._M_t," ");
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          std::operator<<(poVar7," +");
        }
      }
    }
    std::operator<<((ostream *)
                    (((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    proof_stream)._M_t," s 0\n");
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    plVar1 = &(_Var12._M_head_impl)->proof_line;
    *plVar1 = *plVar1 + 1;
    poVar7 = std::operator<<((ostream *)((_Var12._M_head_impl)->proof_stream)._M_t,"ia 1 ~x");
    local_230._M_dataplus._M_p = (pointer)(long)local_210->first;
    local_230._M_string_length = (size_type)t->first;
    pmVar8 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_230);
    std::operator<<(poVar7,(string *)pmVar8);
    ppVar18 = (two_away_from_t->
              super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar13 = (two_away_from_t->
                   super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        uVar4._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t, ppVar13 != ppVar18; ppVar13 = ppVar13 + 1) {
      poVar7 = std::operator<<((ostream *)
                               uVar4._M_t.
                               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                               ._M_head_impl," 1 x");
      local_230._M_dataplus._M_p = (pointer)(long)local_208->first;
      local_230._M_string_length = (size_type)(ppVar13->first).first;
      pmVar8 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,(key_type *)&local_230);
      std::operator<<(poVar7,(string *)pmVar8);
    }
    poVar7 = std::operator<<((ostream *)
                             uVar4._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," >= 1 ; ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::operator<<(poVar7,'\n');
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    plVar1 = &(_Var12._M_head_impl)->proof_line;
    *plVar1 = *plVar1 + 1;
    poVar7 = std::operator<<((ostream *)((_Var12._M_head_impl)->proof_stream)._M_t,"p ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::operator<<(poVar7," ");
    local_230._M_dataplus._M_p = (pointer)(long)t->first;
    std::
    map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  injectivity_constraints,(key_type_conflict1 *)&local_230);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::operator<<(poVar7," + s 0\n");
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    plVar1 = &(_Var12._M_head_impl)->proof_line;
    *plVar1 = *plVar1 + 1;
    poVar7 = std::operator<<((ostream *)((_Var12._M_head_impl)->proof_stream)._M_t,"ia 1 ~x");
    local_230._M_dataplus._M_p = (pointer)(long)local_210->first;
    local_230._M_string_length = (size_type)t->first;
    pmVar8 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_230);
    std::operator<<(poVar7,(string *)pmVar8);
    ppVar18 = (two_away_from_t->
              super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar13 = (two_away_from_t->
                   super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar18;
        ppVar13 = ppVar13 + 1) {
      bVar6 = std::operator==(&ppVar13->first,t);
      if (!bVar6) {
        poVar7 = std::operator<<((ostream *)
                                 (((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                  _M_head_impl)->proof_stream)._M_t," 1 x");
        local_230._M_dataplus._M_p = (pointer)(long)local_208->first;
        local_230._M_string_length = (size_type)(ppVar13->first).first;
        pmVar8 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->variable_mappings,(key_type *)&local_230);
        std::operator<<(poVar7,(string *)pmVar8);
      }
    }
    poVar7 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t," >= 1 ; ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::operator<<(poVar7,'\n');
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    plVar1 = &(_Var12._M_head_impl)->proof_line;
    *plVar1 = *plVar1 + 1;
    things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::push_back
              (&things_to_add_up,&(_Var12._M_head_impl)->proof_line);
    ppVar13 = (two_away_from_t->
              super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_1f0 = ppVar13;
    for (ppVar18 = (two_away_from_t->
                   super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppVar18 != ppVar13;
        ppVar18 = ppVar18 + 1) {
      bVar6 = std::operator==(&ppVar18->first,t);
      if (!bVar6) {
        ppVar16 = (d_n_t->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>const*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<int,std::__cxx11::string>const>>
                           ((d_n_t->
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,ppVar16,ppVar18);
        if (ppVar16 == _Var10._M_current) {
          std::operator<<((ostream *)
                          (((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                          ->proof_stream)._M_t,"p");
          bVar6 = true;
          ppVar17 = (__range2->
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar14 = (__range2->
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; ppVar13 = local_1f0,
              ppVar14 != ppVar17; ppVar14 = ppVar14 + 1) {
            poVar7 = std::operator<<((ostream *)
                                     (((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->proof_stream)._M_t," ");
            local_230._M_dataplus._M_p = (pointer)(long)t->first;
            local_230._M_string_length = (size_type)ppVar14->first;
            local_230.field_2._M_allocated_capacity = (size_type)local_210->first;
            local_230.field_2._8_8_ = 0;
            std::
            map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          adjacency_lines,(key_type *)&local_230);
            std::ostream::_M_insert<long>((long)poVar7);
            if (!bVar6) {
              std::operator<<((ostream *)
                              (((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->proof_stream)._M_t," +");
            }
            poVar7 = std::operator<<((ostream *)
                                     (((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->proof_stream)._M_t," ");
            local_230._M_dataplus._M_p = (pointer)(long)(ppVar18->first).first;
            local_230._M_string_length = (size_type)ppVar14->first;
            local_230.field_2._M_allocated_capacity = (size_type)local_208->first;
            local_230.field_2._8_8_ = 0;
            std::
            map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          adjacency_lines,(key_type *)&local_230);
            poVar7 = std::ostream::_M_insert<long>((long)poVar7);
            std::operator<<(poVar7," +");
            poVar7 = std::operator<<((ostream *)
                                     (((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->proof_stream)._M_t," ");
            local_230._M_dataplus._M_p = (pointer)(long)ppVar14->first;
            std::
            map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          at_most_one_value_constraints,(key_type_conflict1 *)&local_230);
            poVar7 = std::ostream::_M_insert<long>((long)poVar7);
            std::operator<<(poVar7," +");
            bVar6 = false;
          }
          ppVar17 = (ppVar18->second).
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar14 = (ppVar18->second).
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              uVar4._M_t.
              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t, ppVar14 != ppVar17;
              ppVar14 = ppVar14 + 1) {
            poVar7 = std::operator<<((ostream *)
                                     uVar4._M_t.
                                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                     ._M_head_impl," ");
            local_230._M_dataplus._M_p = (pointer)(long)ppVar14->first;
            std::
            map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          injectivity_constraints,(key_type_conflict1 *)&local_230);
            poVar7 = std::ostream::_M_insert<long>((long)poVar7);
            std::operator<<(poVar7," +");
          }
          std::operator<<((ostream *)
                          uVar4._M_t.
                          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl," s 0\n");
          _Var12._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          plVar1 = &(_Var12._M_head_impl)->proof_line;
          *plVar1 = *plVar1 + 1;
          poVar7 = std::operator<<((ostream *)((_Var12._M_head_impl)->proof_stream)._M_t,"ia 1 ~x");
          local_230._M_dataplus._M_p = (pointer)(long)local_210->first;
          local_230._M_string_length = (size_type)t->first;
          pmVar8 = std::
                   map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                 _M_head_impl)->variable_mappings,(key_type *)&local_230);
          poVar7 = std::operator<<(poVar7,(string *)pmVar8);
          poVar7 = std::operator<<(poVar7," 1 ~x");
          local_1c8 = (undefined1  [8])(long)local_208->first;
          local_1c0 = (long)(ppVar18->first).first;
          pmVar8 = std::
                   map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                 _M_head_impl)->variable_mappings,(key_type *)local_1c8);
          poVar7 = std::operator<<(poVar7,(string *)pmVar8);
          poVar7 = std::operator<<(poVar7," >= 1 ; ");
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          std::operator<<(poVar7,'\n');
          _Var12._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          plVar1 = &(_Var12._M_head_impl)->proof_line;
          *plVar1 = *plVar1 + 1;
          std::vector<long,_std::allocator<long>_>::push_back
                    (&things_to_add_up,&(_Var12._M_head_impl)->proof_line);
        }
      }
    }
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    if (8 < (ulong)((long)things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      std::operator<<((ostream *)((_Var12._M_head_impl)->proof_stream)._M_t,"p");
      plVar5 = things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar6 = true;
      for (plVar15 = things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          uVar4._M_t.
          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
          _M_head_impl = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         proof_stream)._M_t, plVar15 != plVar5; plVar15 = plVar15 + 1) {
        poVar7 = std::operator<<((ostream *)
                                 uVar4._M_t.
                                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                 ._M_head_impl," ");
        std::ostream::_M_insert<long>((long)poVar7);
        if (!bVar6) {
          std::operator<<((ostream *)
                          (((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                          ->proof_stream)._M_t," +");
        }
        bVar6 = false;
      }
      std::operator<<((ostream *)
                      uVar4._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl," s 0\n");
      _Var12._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      (_Var12._M_head_impl)->proof_line = (_Var12._M_head_impl)->proof_line + 1;
    }
    std::operator<<((ostream *)
                    ((_Var12._M_head_impl)->proof_stream)._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ,"# 0\n");
    poVar7 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,"ia ");
    std::__cxx11::stringbuf::str();
    poVar7 = std::operator<<(poVar7,(string *)&local_230);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::operator<<(poVar7,'\n');
    std::__cxx11::string::~string((string *)&local_230);
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    local_230._M_string_length = (_Var12._M_head_impl)->proof_line + 1;
    (_Var12._M_head_impl)->proof_line = local_230._M_string_length;
    local_1c8._4_4_ = local_208->first;
    local_1c8._0_4_ = t->first;
    local_230._M_dataplus._M_p = "";
    local_1c0 = CONCAT44(local_1fc,local_210->first);
    local_230.field_2._M_allocated_capacity = local_230._M_string_length;
    std::
    _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
    ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,long,char_const*>>
              ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
                *)&(_Var12._M_head_impl)->adjacency_lines,(tuple<int,_int,_int,_int> *)local_1c8,
               (tuple<long,_long,_const_char_*> *)&local_230);
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string,long&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(_Var12._M_head_impl)->cached_proof_lines,&local_230,
               &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line
              );
    std::__cxx11::string::~string((string *)&local_230);
    std::operator<<((ostream *)
                    (((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    proof_stream)._M_t,"w 1\n");
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&things_to_add_up.super__Vector_base<long,_std::allocator<long>_>);
  }
  else {
    things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)CONCAT44(local_208->first,t->first);
    local_230._M_dataplus._M_p = "";
    things_to_add_up.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)CONCAT44(local_1fc,local_210->first);
    local_230._M_string_length =
         *(size_type *)
          ((long)iVar9.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                 ._M_cur + 0x28);
    local_230.field_2._M_allocated_capacity = local_230._M_string_length;
    std::
    _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
    ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,long,char_const*>>
              ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
                *)&(_Var12._M_head_impl)->adjacency_lines,
               (tuple<int,_int,_int,_int> *)&things_to_add_up,
               (tuple<long,_long,_const_char_*> *)&local_230);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&tidied_up);
  return;
}

Assistant:

auto Proof::create_exact_path_graphs(
    int g,
    const NamedVertex & p,
    const NamedVertex & q,
    const vector<NamedVertex> & between_p_and_q,
    const NamedVertex & t,
    const vector<NamedVertex> & n_t,
    const vector<pair<NamedVertex, vector<NamedVertex>>> & two_away_from_t,
    const vector<NamedVertex> & d_n_t) -> void
{
    // tidy up to get what we wanted. do this first so we can check for duplicates
    stringstream tidied_up;
    tidied_up << "1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : d_n_t)
        if (u != t)
            tidied_up << " 1 x" << _imp->variable_mappings[pair{q.first, u.first}];
    tidied_up << " >= 1 ;";

    auto it = _imp->cached_proof_lines.find(tidied_up.str());
    if (it != _imp->cached_proof_lines.end()) {
        _imp->adjacency_lines.emplace(tuple{g, p.first, q.first, t.first}, tuple{it->second, it->second, ""});
        return;
    }

    *_imp->proof_stream << "* adjacency " << p.second << " maps to " << t.second << " in G^[" << g << "x2] so " << q.second << " maps to one of...\n";

    if (_imp->recover_encoding) {
        recover_injectivity_constraint(t.first);

        for (auto & b : between_p_and_q) {
            recover_adjacency_lines(0, p.first, b.first, t.first);
            for (auto & w : n_t)
                recover_adjacency_lines(0, b.first, q.first, w.first);
            recover_at_most_one_constraint(b.first);
        }

        for (auto & u : two_away_from_t) {
            if ((u.first == t) || (d_n_t.end() != find(d_n_t.begin(), d_n_t.end(), u.first)))
                continue;

            for (auto & b : between_p_and_q) {
                recover_adjacency_lines(0, p.first, b.first, t.first);
                recover_adjacency_lines(0, q.first, b.first, u.first.first);
            }

            for (auto & z : u.second)
                recover_injectivity_constraint(z.first);
        }
    }

    *_imp->proof_stream << "# 1\n";
    *_imp->proof_stream << "p";

    // if p maps to t then things in between_p_and_q have to go to one of these...
    bool first = true;
    for (auto & b : between_p_and_q) {
        *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, p.first, b.first, t.first}]);
        if (! first)
            *_imp->proof_stream << " s +";
        first = false;
    }

    // now go two hops out: cancel between_p_and_q things with where can q go
    for (auto & b : between_p_and_q) {
        for (auto & w : n_t) {
            // due to loops or labels, it might not be possible to map to w
            auto i = _imp->adjacency_lines.find(tuple{0, b.first, q.first, w.first});
            if (i != _imp->adjacency_lines.end())
                *_imp->proof_stream << " " << get<1>(i->second) << " +";
        }
    }

    *_imp->proof_stream << " s 0\n";
    ++_imp->proof_line;

    // first tidy-up step: if p maps to t then q maps to something a two-walk away from t
    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : two_away_from_t)
        *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{q.first, u.first.first}];
    *_imp->proof_stream << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;

    // if p maps to t then q does not map to t
    *_imp->proof_stream << "p " << _imp->proof_line << " " << get<1>(_imp->injectivity_constraints[t.first]) << " + s 0\n";
    ++_imp->proof_line;

    // and cancel out stray extras from injectivity
    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : two_away_from_t)
        if (u.first != t)
            *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{q.first, u.first.first}];
    *_imp->proof_stream << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;

    vector<long> things_to_add_up;
    things_to_add_up.push_back(_imp->proof_line);

    // cancel out anything that is two away from t, but by insufficiently many paths
    for (auto & u : two_away_from_t) {
        if ((u.first == t) || (d_n_t.end() != find(d_n_t.begin(), d_n_t.end(), u.first)))
            continue;

        *_imp->proof_stream << "p";
        bool first = true;
        for (auto & b : between_p_and_q) {
            *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, p.first, b.first, t.first}]);
            if (! first)
                *_imp->proof_stream << " +";
            first = false;
            *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, q.first, b.first, u.first.first}]) << " +";
            *_imp->proof_stream << " " << get<1>(_imp->at_most_one_value_constraints[b.first]) << " +";
        }

        for (auto & z : u.second)
            *_imp->proof_stream << " " << get<1>(_imp->injectivity_constraints[z.first]) << " +";

        *_imp->proof_stream << " s 0\n";
        ++_imp->proof_line;

        // want: ~x_p_t + ~x_q_u >= 1
        *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}]
                            << " 1 ~x" << _imp->variable_mappings[pair{q.first, u.first.first}] << " >= 1 ; "
                            << _imp->proof_line << '\n';
        things_to_add_up.push_back(++_imp->proof_line);
    }

    // do the getting rid of
    if (things_to_add_up.size() > 1) {
        bool first = true;
        *_imp->proof_stream << "p";
        for (auto & t : things_to_add_up) {
            *_imp->proof_stream << " " << t;
            if (! first)
                *_imp->proof_stream << " +";
            first = false;
        }
        *_imp->proof_stream << " s 0\n";
        ++_imp->proof_line;
    }

    *_imp->proof_stream << "# 0\n";
    *_imp->proof_stream << "ia " << tidied_up.str() << " " << _imp->proof_line << '\n';
    ++_imp->proof_line;
    _imp->adjacency_lines.emplace(tuple{g, p.first, q.first, t.first}, tuple{_imp->proof_line, _imp->proof_line, ""});
    _imp->cached_proof_lines.emplace(tidied_up.str(), _imp->proof_line);
    *_imp->proof_stream << "w 1\n";
}